

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.c
# Opt level: O1

void * coll_deque_insert_at(coll_deque_t *deque,void *data,size_t index)

{
  ulong uVar1;
  void **ppvVar2;
  
  uVar1 = deque->len;
  if (uVar1 < index) {
    data = (void *)0x0;
  }
  else if (uVar1 == index) {
    coll_deque_append(deque,data);
  }
  else {
    if (uVar1 == deque->cap) {
      coll_deque_resize(deque);
    }
    uVar1 = (deque->head + index) % deque->cap;
    if (index < deque->len >> 1) {
      coll_deque_reserve(deque,uVar1,true);
      ppvVar2 = deque->data + (uVar1 - 1);
    }
    else {
      coll_deque_reserve(deque,uVar1,false);
      ppvVar2 = deque->data + uVar1;
    }
    *ppvVar2 = data;
    deque->len = deque->len + 1;
  }
  return data;
}

Assistant:

void *coll_deque_insert_at(coll_deque_t *deque, void *data, size_t index) {
    if (index > deque->len) {
        return NULL;
    } else if (index == deque->len) {
        return coll_deque_append(deque, data);
    }
    if (deque->len == deque->cap) {
        coll_deque_resize(deque);
    }

    size_t pos = index_to_pos(deque, index);

    if (index < deque->len / 2) {
        coll_deque_reserve(deque, pos, true);
        deque->data[--pos] = data;
    } else {
        coll_deque_reserve(deque, pos, false);
        deque->data[pos] = data;
    }
    ++(deque->len);
    return data;
}